

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O3

void __thiscall trento::Event::Event(Event *this,VarMap *var_map)

{
  _Rb_tree_header *p_Var1;
  _Manager_type p_Var2;
  undefined1 auVar3 [16];
  any *paVar4;
  double *pdVar5;
  int iVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  _Any_data __tmp;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  undefined1 local_48 [16];
  Event *local_38;
  undefined8 uStack_30;
  
  *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) = 0
  ;
  (this->compute_reduced_thickness_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->compute_reduced_thickness_)._M_invoker = (_Invoker_type)0x0;
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"normalization","");
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar5 = boost::any_cast<double_const&>(paVar4);
  dVar8 = *pdVar5;
  if ((_Manager_type *)local_68._M_unused._0_8_ != &local_58) {
    local_48._0_8_ = *pdVar5;
    operator_delete(local_68._M_unused._M_object);
    dVar8 = (double)local_48._0_8_;
  }
  this->norm_ = dVar8;
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"grid-step","");
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar5 = boost::any_cast<double_const&>(paVar4);
  dVar8 = *pdVar5;
  if ((_Manager_type *)local_68._M_unused._0_8_ != &local_58) {
    local_48._0_8_ = *pdVar5;
    operator_delete(local_68._M_unused._M_object);
    dVar8 = (double)local_48._0_8_;
  }
  this->dxy_ = dVar8;
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"grid-max","");
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar5 = boost::any_cast<double_const&>(paVar4);
  dVar8 = this->dxy_;
  auVar7._0_8_ = (*pdVar5 + *pdVar5) / dVar8;
  auVar7._8_8_ = 0;
  auVar7 = vroundsd_avx(auVar7,auVar7,10);
  iVar6 = (int)auVar7._0_8_;
  if ((_Manager_type *)local_68._M_unused._0_8_ != &local_58) {
    operator_delete(local_68._M_unused._M_object);
    dVar8 = this->dxy_;
  }
  local_68._8_8_ = SEXT48(iVar6);
  this->nsteps_ = iVar6;
  this->xymax_ = (double)iVar6 * 0.5 * dVar8;
  local_68._M_unused._M_object = (void *)0x0;
  local_58 = (_Manager_type)0x0;
  (this->TA_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  base_ = (double *)0x0;
  (this->TA_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[0] = 1;
  (this->TA_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[1] = 0;
  *(undefined2 *)
   (this->TA_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>
   .storage_.ascending_.elems = 0x101;
  p_Stack_50 = (_Invoker_type)local_68._8_8_;
  boost::const_multi_array_ref<double,_2UL,_double_*>::init_from_extent_gen
            ((const_multi_array_ref<double,_2UL,_double_*> *)&this->TA_,(extent_gen<2UL> *)&local_68
            );
  boost::multi_array<double,_2UL,_std::allocator<double>_>::allocate_space(&this->TA_);
  local_68._8_8_ = SEXT48(this->nsteps_);
  local_68._M_unused._M_object = (void *)0x0;
  local_58 = (_Manager_type)0x0;
  (this->TB_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  base_ = (double *)0x0;
  (this->TB_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[0] = 1;
  (this->TB_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[1] = 0;
  *(undefined2 *)
   (this->TB_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>
   .storage_.ascending_.elems = 0x101;
  p_Stack_50 = (_Invoker_type)local_68._8_8_;
  boost::const_multi_array_ref<double,_2UL,_double_*>::init_from_extent_gen
            ((const_multi_array_ref<double,_2UL,_double_*> *)&this->TB_,(extent_gen<2UL> *)&local_68
            );
  boost::multi_array<double,_2UL,_std::allocator<double>_>::allocate_space(&this->TB_);
  local_68._8_8_ = SEXT48(this->nsteps_);
  local_68._M_unused._M_object = (void *)0x0;
  local_58 = (_Manager_type)0x0;
  (this->TR_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  base_ = (double *)0x0;
  (this->TR_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[0] = 1;
  (this->TR_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>.
  storage_.ordering_.elems[1] = 0;
  *(undefined2 *)
   (this->TR_).super_multi_array_ref<double,_2UL>.super_const_multi_array_ref<double,_2UL,_double_*>
   .storage_.ascending_.elems = 0x101;
  p_Stack_50 = (_Invoker_type)local_68._8_8_;
  boost::const_multi_array_ref<double,_2UL,_double_*>::init_from_extent_gen
            ((const_multi_array_ref<double,_2UL,_double_*> *)&this->TR_,(extent_gen<2UL> *)&local_68
            );
  boost::multi_array<double,_2UL,_std::allocator<double>_>::allocate_space(&this->TR_);
  p_Var1 = &(this->eccentricity_)._M_t._M_impl.super__Rb_tree_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->eccentricity_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"reduced-thickness","");
  paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar5 = boost::any_cast<double_const&>(paVar4);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pdVar5;
  if ((_Manager_type *)local_68._M_unused._0_8_ != &local_58) {
    local_48 = auVar9;
    operator_delete(local_68._M_unused._M_object);
    auVar9 = local_48;
  }
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar7 = vandpd_avx512vl(auVar9,auVar3);
  dVar8 = auVar9._0_8_;
  if (1e-12 <= auVar7._0_8_) {
    if (dVar8 <= 0.0) {
      local_68._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
      local_68._8_8_ =
           *(undefined8 *)
            ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
      *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
      *(double *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
           dVar8;
      local_58 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      p_Stack_50 = (this->compute_reduced_thickness_)._M_invoker;
      p_Var2 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      (this->compute_reduced_thickness_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:71:34)>
           ::_M_manager;
      (this->compute_reduced_thickness_)._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:71:34)>
           ::_M_invoke;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_68,&local_68,__destroy_functor);
      }
    }
    else {
      local_68._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
      local_68._8_8_ =
           *(undefined8 *)
            ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
      *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
      *(double *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
           dVar8;
      local_58 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      p_Stack_50 = (this->compute_reduced_thickness_)._M_invoker;
      p_Var2 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
      (this->compute_reduced_thickness_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:66:34)>
           ::_M_manager;
      (this->compute_reduced_thickness_)._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:66:34)>
           ::_M_invoke;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_68,&local_68,__destroy_functor);
      }
    }
  }
  else {
    uStack_30 = 0;
    local_68._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(this->compute_reduced_thickness_).super__Function_base._M_functor;
    local_68._8_8_ =
         *(undefined8 *)
          ((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8);
    *(Event **)&(this->compute_reduced_thickness_).super__Function_base._M_functor = this;
    *(undefined8 *)((long)&(this->compute_reduced_thickness_).super__Function_base._M_functor + 8) =
         0;
    local_58 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
    p_Stack_50 = (this->compute_reduced_thickness_)._M_invoker;
    p_Var2 = (this->compute_reduced_thickness_).super__Function_base._M_manager;
    (this->compute_reduced_thickness_).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:62:34)>
         ::_M_manager;
    (this->compute_reduced_thickness_)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Duke-QCD[P]trento/src/event.cxx:62:34)>
         ::_M_invoke;
    if (p_Var2 != (_Manager_type)0x0) {
      local_38 = this;
      (*p_Var2)(&local_68,&local_68,__destroy_functor);
    }
  }
  return;
}

Assistant:

Event::Event(const VarMap& var_map)
    : norm_(var_map["normalization"].as<double>()),
      dxy_(var_map["grid-step"].as<double>()),
      nsteps_(std::ceil(2.*var_map["grid-max"].as<double>()/dxy_)),
      xymax_(.5*nsteps_*dxy_),
      TA_(boost::extents[nsteps_][nsteps_]),
      TB_(boost::extents[nsteps_][nsteps_]),
      TR_(boost::extents[nsteps_][nsteps_]) {
  // Choose which version of the generalized mean to use based on the
  // configuration.  The possibilities are defined above.  See the header for
  // more information.
  auto p = var_map["reduced-thickness"].as<double>();

  if (std::fabs(p) < TINY) {
    compute_reduced_thickness_ = [this]() {
      compute_reduced_thickness(geometric_mean);
    };
  } else if (p > 0.) {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return positive_pmean(p, a, b); });
    };
  } else {
    compute_reduced_thickness_ = [this, p]() {
      compute_reduced_thickness(
        [p](double a, double b) { return negative_pmean(p, a, b); });
    };
  }
}